

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O0

void __thiscall LexerReadVarValue::Run(LexerReadVarValue *this)

{
  pointer *this_00;
  EvalString *this_01;
  Test *pTVar1;
  bool bVar2;
  string local_a8;
  undefined1 local_78 [8];
  string err;
  EvalString eval;
  Lexer lexer;
  LexerReadVarValue *this_local;
  
  this_00 = &eval.parsed_.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Lexer::Lexer((Lexer *)this_00,"plain text $var $VaR ${x}\n");
  this_01 = (EvalString *)((long)&err.field_2 + 8);
  EvalString::EvalString(this_01);
  std::__cxx11::string::string((string *)local_78);
  pTVar1 = g_current_test;
  bVar2 = Lexer::ReadVarValue((Lexer *)this_00,this_01,(string *)local_78);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/lexer_test.cc"
             ,0x1a,"lexer.ReadVarValue(&eval, &err)");
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_78);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/lexer_test.cc"
             ,0x1b,"\"\" == err");
  pTVar1 = g_current_test;
  EvalString::Serialize_abi_cxx11_(&local_a8,(EvalString *)((long)&err.field_2 + 8));
  bVar2 = std::operator==("[plain text ][$var][ ][$VaR][ ][$x]",&local_a8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/lexer_test.cc"
             ,0x1d,"\"[plain text ][$var][ ][$VaR][ ][$x]\" == eval.Serialize()");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)local_78);
  EvalString::~EvalString((EvalString *)((long)&err.field_2 + 8));
  return;
}

Assistant:

TEST(Lexer, ReadVarValue) {
  Lexer lexer("plain text $var $VaR ${x}\n");
  EvalString eval;
  string err;
  EXPECT_TRUE(lexer.ReadVarValue(&eval, &err));
  EXPECT_EQ("", err);
  EXPECT_EQ("[plain text ][$var][ ][$VaR][ ][$x]",
            eval.Serialize());
}